

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
CTtRenderMeshInfoUserData::Read(CTtRenderMeshInfoUserData *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  ON__INT32 local_24;
  ON_BinaryArchive *pOStack_20;
  int nVersion;
  ON_BinaryArchive *binary_archive_local;
  CTtRenderMeshInfoUserData *this_local;
  
  local_24 = 1;
  pOStack_20 = binary_archive;
  binary_archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::ReadInt(binary_archive,&local_24);
  if (bVar1) {
    if (local_24 == 1) {
      bVar1 = ON_GeometryFingerprint::Read(&(this->m_info).m_geometryFingerprint,pOStack_20);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::ReadInt(pOStack_20,&(this->m_info).m_sourceFaceId);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool Read(ON_BinaryArchive& binary_archive)
  {
    if (!m_bArchive)
      return true;
    int nVersion = 1;
    if (!binary_archive.ReadInt(&nVersion))
      return false;
    if (1 != nVersion)
      return false;
    if (!m_info.m_geometryFingerprint.Read(binary_archive))
      return false;
    if (!binary_archive.ReadInt(&m_info.m_sourceFaceId))
      return false;
    return true;
  }